

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astFunctionApplicationNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t argument;
  sysbvm_bitflags_t applicationFlags;
  size_t i;
  size_t sVar2;
  size_t argumentCount_00;
  anon_struct_24_3_53f9e59d gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_118;
  undefined8 local_108;
  anon_struct_136_2_7a050327_for_gcRoots *local_100;
  sysbvm_stackFrameRecord_t local_f8;
  undefined8 local_e8;
  undefined1 *local_e0;
  sysbvm_functionCallFrameStack_t callFrameStack;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.function = 0;
  gcFrame.argumentNode = 0;
  gcFrame.result = 0;
  local_f8.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_f8.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_f8._12_4_ = 0;
  local_e8 = 3;
  local_e0 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_f8);
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  uVar1 = *(ulong *)(*arguments + 0x30);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    argumentCount_00 = (size_t)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  else {
    argumentCount_00 = 0;
  }
  gcFrame.function =
       sysbvm_interpreter_evaluateASTWithEnvironment
                 (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  memset(&callFrameStack,0,0xb0);
  local_118.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_118.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_118._12_4_ = 0;
  local_108 = 0x11;
  local_100 = &callFrameStack.gcRoots;
  sysbvm_stackFrame_pushRecord(&local_118);
  uVar1 = *(ulong *)(*arguments + 0x38);
  if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
    applicationFlags = (long)uVar1 >> 4;
  }
  else {
    applicationFlags = *(sysbvm_bitflags_t *)(uVar1 + 0x10);
  }
  sysbvm_functionCallFrameStack_begin
            (context,&callFrameStack,gcFrame.function,argumentCount_00,applicationFlags);
  for (sVar2 = 0; argumentCount_00 != sVar2; sVar2 = sVar2 + 1) {
    uVar1 = *(ulong *)(*arguments + 0x30);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      gcFrame.argumentNode = *(sysbvm_tuple_t *)(uVar1 + 0x10 + sVar2 * 8);
    }
    else {
      gcFrame.argumentNode = 0;
    }
    argument = sysbvm_interpreter_evaluateASTWithEnvironment
                         (context,gcFrame.argumentNode,arguments[1]);
    sysbvm_functionCallFrameStack_push(&callFrameStack,argument);
  }
  sysbvm_stackFrame_popRecord(&local_118);
  gcFrame.result = sysbvm_functionCallFrameStack_finish(context,&callFrameStack);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_f8);
  return gcFrame.result;
}

Assistant:

static sysbvm_tuple_t sysbvm_astFunctionApplicationNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astFunctionApplicationNode_t **applicationNode = (sysbvm_astFunctionApplicationNode_t**)node;
    struct {
        sysbvm_tuple_t function;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*applicationNode)->super.sourcePosition);

    size_t applicationArgumentCount = sysbvm_array_getSize((*applicationNode)->arguments);
    gcFrame.function = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*applicationNode)->functionExpression, *environment);

    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);
    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, gcFrame.function, applicationArgumentCount, sysbvm_tuple_bitflags_decode((*applicationNode)->applicationFlags));

    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, i);
        sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_interpreter_evaluateASTWithEnvironment(context, gcFrame.argumentNode, *environment));
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    gcFrame.result = sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}